

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# was_added.c
# Opt level: O1

int find_added(pair_t *l,uint32 s)

{
  while( true ) {
    if (l == (pair_t *)0x0) {
      return 0;
    }
    if (l->src_id == s) break;
    l = l->next;
  }
  return 1;
}

Assistant:

int
find_added(pair_t *l, uint32 s)
{
    pair_t *c;

    for (c = l; c && (c->src_id != s); c = c->next);

    if (c == NULL) {
	/* either L is an empty list or S is not on the list */
	return FALSE;
    }
    else {
	return TRUE;
    }
}